

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvar.c
# Opt level: O1

void nnewframe(frameex1 *newpfra2,DLword *achain,int name)

{
  ushort uVar1;
  int iVar2;
  DLword *pDVar3;
  undefined4 uVar4;
  DLword *pDVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  DLword *pDVar10;
  DLword *pDVar11;
  DLword *pDVar12;
  
LAB_00121ea3:
  do {
    uVar1 = newpfra2->alink;
    if (uVar1 == 0) {
      error("alink = 0 in nnewframe");
    }
    else if (uVar1 == 0xb) {
      iVar2 = name * 10 + 0x2c0002;
      if ((name & 0xfff0000U) != 0) {
        iVar2 = name + 2;
      }
      *(undefined2 *)((ulong)(achain + 1) ^ 2) = (short)((uint)iVar2 >> 0x10);
      *(short *)((ulong)achain ^ 2) = (short)iVar2;
switchD_00122038_caseD_1:
      return;
    }
    pDVar3 = Stackspace;
    uVar9 = uVar1 & 0xfffffffe;
    newpfra2 = (frameex1 *)(Stackspace + ((ulong)uVar9 - 10));
    if ((*(byte *)((long)Stackspace + (ulong)uVar9 * 2 + -0x11) & 2) == 0) {
      uVar7 = *(uint *)(Stackspace + ((ulong)uVar9 - 8));
    }
    else {
      uVar7 = *(uint *)(Stackspace + ((ulong)uVar9 - 4));
    }
    if ((uVar7 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
    }
  } while (Lisp_world[(ulong)uVar7 + 7] < 2);
  pDVar5 = Lisp_world + (ulong)uVar7 + 8;
  uVar8 = (ulong)(Lisp_world[(ulong)uVar7 + 7] >> 1);
  pDVar10 = Lisp_world + (ulong)uVar7 + uVar8 * 2 + 8;
LAB_00121f46:
  pDVar11 = pDVar5 + 2;
  pDVar12 = pDVar11;
  if (*(int *)pDVar5 != name) goto switchD_00122038_caseD_6;
LAB_00121f57:
  uVar7 = *(uint *)(pDVar11 + uVar8 * 2 + -2) * 2;
  uVar6 = *(uint *)(pDVar11 + uVar8 * 2 + -2) & 0xff000000;
  if (uVar6 == 0) {
    *(undefined2 *)((ulong)(achain + 1) ^ 2) = 1;
    *(short *)((ulong)achain ^ 2) =
         (short)uVar7 + *(short *)((ulong)(pDVar3 + ((ulong)uVar9 - 0xb)) ^ 2);
LAB_00122014:
    uVar4 = 1;
  }
  else if (uVar6 == 0xc0000000) {
    pDVar5 = pDVar3 + (ulong)uVar9 + (ulong)(uVar7 & 0x1ffffffe);
    uVar4 = 9;
    if ((*(byte *)((ulong)pDVar5 ^ 2) & 1) == 0) {
      *(undefined4 *)achain = *(undefined4 *)pDVar5;
      goto LAB_00122014;
    }
  }
  else {
    error("Stack corrupted: bad value in name table");
    uVar4 = 0;
  }
  pDVar5 = pDVar11;
  pDVar12 = pDVar11;
  switch(uVar4) {
  case 0:
  case 4:
    goto switchD_00122038_caseD_0;
  default:
    goto switchD_00122038_caseD_1;
  case 6:
    break;
  case 9:
    goto switchD_00122038_caseD_9;
  }
switchD_00122038_caseD_6:
  pDVar11 = pDVar12 + 2;
  pDVar5 = pDVar11;
  if (*(int *)pDVar12 != name) goto switchD_00122038_caseD_0;
  goto LAB_00121f57;
switchD_00122038_caseD_0:
  if (pDVar10 <= pDVar5) goto switchD_00122038_caseD_9;
  goto LAB_00121f46;
switchD_00122038_caseD_9:
  goto LAB_00121ea3;
}

Assistant:

void nnewframe(struct frameex1 *newpfra2, DLword *achain, int name)
/* pointer to new frame extension */
/* pointer to 1st word of the searching
   FVAR slot in CurrentFrameExtension */
/* Atom index num. of target FVAR slot. */
{
  NAMETABLE *pindex; /* '90/06/06 osamu changed from DLword *
                               * index to indexs of new name table */
  UNSIGNED i;        /* temp for control */
  int nametablesize; /* NameTable size of current function header. */
  int ph;            /* alink temp, also phase */

newframe:
  /* assume that apframe1 points to the next frame to be scanned */
  ph = newpfra2->alink;
  if (ph == 0) error("alink = 0 in nnewframe");
  if (ph == ENDSTACKMARK) {
/* endStack */
#ifdef BIGATOMS
    if ((name & SEGMASK) != 0) /* New symbol */
    {
      int result = name + NEWATOM_VALUE_OFFSET;
      /*    printf("NEW-SYMBOL in nnewframe, 0x%x, result = 0x%x\n", name, result); */
      GETBASEWORD(achain, 1) = result >> 16;
      GETBASEWORD(achain, 0) = result & 0xFFFF;
    } else
#endif /* BIGATOMS */

#ifdef BIGVM
        if (name & SEGMASK) { /* It's a big-atom, so just offset from the base to get value */
      int result = name + NEWATOM_VALUE_OFFSET;
      GETBASEWORD(achain, 1) = result >> 16;
      GETBASEWORD(achain, 0) = result & 0xFFFF;
    } else { /* It's an "old" atom, so offset into the table of atoms */
      int result = (ATOMS_HI << 16) + (10 * name) + NEWATOM_VALUE_OFFSET;
      GETBASEWORD(achain, 1) = result >> 16;
      GETBASEWORD(achain, 0) = result & 0xFFFF;
    }
#else
    if (name >= 0x8000) {
      GETBASEWORD(achain, 1) = VALS_HI + 1;
      GETBASEWORD(achain, 0) = name * 2;
    } else {
      GETBASEWORD(achain, 1) = VALS_HI;
      GETBASEWORD(achain, 0) = name * 2;
    }
#endif /* BIGVM */
    return;
  }

  ph &= 0xFFFE; /* to mask off SLOW bit */
  newpfra2 = (struct frameex1 *)(-FRAMESIZE + Stackspace + ph);

  {                                  /* open new block to try and conserve address */
    struct fnhead *newpfn2; /* ptr to new fn header */

    if (newpfra2->validnametable) /* check VALIDNAMETABLE */
#ifdef BIGVM
      newpfn2 = (struct fnhead *)NativeAligned4FromLAddr(newpfra2->nametable);
    else
      newpfn2 = (struct fnhead *)NativeAligned4FromLAddr(newpfra2->fnheader);
#else
      newpfn2 = (struct fnhead *)NativeAligned4FromLAddr(
          ((newpfra2->hi2nametable) << 16 | newpfra2->lonametable));
    else
      newpfn2 = (struct fnhead *)NativeAligned4FromLAddr(
          ((newpfra2->hi2fnheader) << 16 | newpfra2->lofnheader));
#endif /* BIGVM */
    pindex = (NAMETABLE *)((DLword *)newpfn2 + FNHEADSIZE);
/* now pindex points 1st word of Nametable. */
#ifdef BIGATOMS
    nametablesize = (newpfn2->ntsize >> 1); /* ntsize is # of words in NT
                                               not # of element */
#else
    nametablesize = newpfn2->ntsize;
#endif
  }

  i = (UNSIGNED)(pindex + nametablesize);
  for (; (UNSIGNED)i > (UNSIGNED)pindex;) { /* searching in NewFuncHeader */
#ifdef BIGATOMS
/* These used to be GETWORDs, but NAMETABLE is a CELL in 3-byte */
#if 1
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 1;
      goto foundit;
    }
  cont2:
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 0;
      goto foundit;
    }
#else
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 1;
      goto foundit;
    }
  cont2:
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 2;
      goto foundit;
    }
  cont3:
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 3;
      goto foundit;
    }
  cont4:
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 0;
      goto foundit;
    }
#endif

#else
    if (GETWORD((NAMETABLE *)pindex++) == (DLword)name) {
      ph = 1;
      goto foundit;
    }
  cont2:
    if (GETWORD((NAMETABLE *)pindex++) == (DLword)name) {
      ph = 2;
      goto foundit;
    }
  cont3:
    if (GETWORD((NAMETABLE *)pindex++) == (DLword)name) {
      ph = 3;
      goto foundit;
    }
  cont4:
    if (GETWORD((NAMETABLE *)pindex++) == (DLword)name) {
      ph = 0;
      goto foundit;
    }
#endif
    continue;
  foundit : {
    int fvartype;   /* probing fvar vartype */
    int fvaroffset; /* probing fvar varoffset */
    DLword *ppvar;  /* ptr to probing var candidate */
#ifdef BIGATOMS
    fvartype = (int)*(pindex + nametablesize - 1);
#else
    fvartype = GETWORD(pindex + nametablesize - 1);
#endif /* BIGATOMS */

    fvaroffset = NT_OFFSET_MASK & fvartype;
    fvaroffset <<= 1;
    fvartype &= NT_TYPE_MASK;
    switch (fvartype) {
      case FVPVARHI: /* 0x8000 or 0x80000000(BIGATOMS) */
        ppvar = FRAMESIZE + (DLword *)newpfra2 + fvaroffset;
        /* ppvar points to argued Pvar */
        if (WBITSPTR(ppvar)->xMSB) /* check UNBOUND (if *ppvar is negative , unbound) */
          switch (ph) {
            case 0: continue;
            case 1:
              goto cont2;
              /* case 2 : goto cont3;
              case 3 : goto cont4; */
          }
        GETBASEWORD(achain, 1) = STK_HI;
        GETBASEWORD(achain, 0) = 0xFFFF & LAddrFromNative(ppvar);
        /* save High word of PVAR slot address to FVAR slot */
        /* achain points to target FVAR slot */
        return;
      case FVFVARHI: /* 0xC000 or 0xC0000000(BIGATOMS) */
        ppvar = FRAMESIZE + (DLword *)newpfra2 + fvaroffset;
        if (WBITSPTR(ppvar)->LSB) goto endlookfor;
        /* Not Found in new FnHeader, scan next one. */
        *((int *)achain) = *((int *)ppvar);
        /* save address of FX to FVAR slot */
        /* achain points to target FVAR slot */
        return;
      case FVIVARHI: /* 0x000: */
        ppvar = -1 + (DLword *)newpfra2;
        /* ppvar points to IVAR field in Basic  frame */
        GETBASEWORD(achain, 1) = STK_HI;
        GETBASEWORD(achain, 0) = GETWORD(ppvar) + fvaroffset;
        return;
      default: error("Stack corrupted: bad value in name table");
    } /* end switch */
  }   /* end if */
  }   /* end for */

endlookfor:
  goto newframe; /* scan the next one */
}